

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_eff_lore_color_resist(parser *p)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  int local_2c;
  wchar_t attr;
  char *color;
  blow_effect *eff;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getsym(p,"color");
    sVar2 = strlen(__s);
    if (sVar2 < 2) {
      local_2c = color_char_to_attr(*__s);
    }
    else {
      local_2c = color_text_to_attr(__s);
    }
    if (local_2c < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      *(char *)((long)pvVar1 + 0x19) = (char)local_2c;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_eff_lore_color_resist(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	const char *color;
	int attr;

	if (!eff)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	color = parser_getsym(p, "color");
	if (strlen(color) > 1)
		attr = color_text_to_attr(color);
	else
		attr = color_char_to_attr(color[0]);
	if (attr < 0)
		return PARSE_ERROR_INVALID_COLOR;
	eff->lore_attr_resist = attr;
	return PARSE_ERROR_NONE;
}